

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

TrodesConfig * __thiscall TrodesConfig::operator=(TrodesConfig *this,TrodesConfig *obj)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  vector<NDevice,_std::allocator<NDevice>_> local_30;
  
  iVar1 = copy(obj,(EVP_PKEY_CTX *)obj,in_RDX);
  std::vector<NDevice,_std::allocator<NDevice>_>::vector
            (&local_30,
             (vector<NDevice,_std::allocator<NDevice>_> *)(CONCAT44(extraout_var,iVar1) + 8));
  std::vector<NDevice,_std::allocator<NDevice>_>::_M_move_assign(&this->devices,&local_30);
  std::vector<NDevice,_std::allocator<NDevice>_>::~vector(&local_30);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_30,
             (vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)(CONCAT44(extraout_var,iVar1) + 0x20))
  ;
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::_M_move_assign(&this->nTrodes,&local_30);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_30);
  return this;
}

Assistant:

TrodesConfig& TrodesConfig::operator = (const TrodesConfig &obj) {
    TrodesConfig *objCpy = obj.copy();
    devices = objCpy->getDevices();
    nTrodes = objCpy->getNTrodes();
    return(*this);
}